

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RepeatLoopIfSetInst::Exec
          (RepeatLoopIfSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  bool bVar1;
  BeginLoopIfSetInst *pBVar2;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  uint8 *puVar3;
  LoopInfo *loopInfo;
  BeginLoopIfSetInst *begin;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  RepeatLoopIfSetInst *this_local;
  
  pBVar2 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopIfSetInst>
                     (matcher,BeginLoopIfSet,(this->super_RepeatLoopMixin).beginLabel);
  origLoopInfo = Matcher::LoopIdToLoopInfo
                           (matcher,(pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId
                           );
  if (((pBVar2->super_BeginLoopMixin).hasInnerNondet & 1U) != 0) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId,origLoopInfo
               ,matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  origLoopInfo->number = origLoopInfo->number + 1;
  Matcher::CompStats(matcher);
  if ((*inputOffset < inputLength) &&
     (bVar1 = RuntimeCharSet<char16_t>::Get
                        (&(pBVar2->super_SetMixin<false>).set,input[*inputOffset]), bVar1)) {
    if (((pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper == 0xffffffff) ||
       (origLoopInfo->number <
        (pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper)) {
      if (((pBVar2->super_BeginLoopMixin).hasInnerNondet & 1U) == 0) {
        Matcher::ResetInnerGroups
                  (matcher,(pBVar2->super_BodyGroupsMixin).minBodyGroupId,
                   (pBVar2->super_BodyGroupsMixin).maxBodyGroupId);
      }
      else {
        Matcher::SaveInnerGroups
                  (matcher,(pBVar2->super_BodyGroupsMixin).minBodyGroupId,
                   (pBVar2->super_BodyGroupsMixin).maxBodyGroupId,true,input,contStack);
      }
      puVar3 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 0x43);
      *instPointer = puVar3;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ =
           Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    }
  }
  else if (origLoopInfo->number <
           (pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    puVar3 = Matcher::LabelToInstPointer(matcher,(pBVar2->super_BeginLoopMixin).exitLabel);
    *instPointer = puVar3;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool RepeatLoopIfSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopIfSetInst* begin = matcher.L2I(BeginLoopIfSet, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        if (begin->hasInnerNondet)
        {
            // May end up backtracking into loop body for iteration just completed: see above.
            PUSH(contStack, RestoreLoopCont, begin->loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        loopInfo->number++;

#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && begin->set.Get(input[inputOffset]))
        {
            if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
            {
                // If the loop body's first set and the loop's follow set are disjoint, we can just fail here since
                // we know the next character in the input is in the loop body's first set.
                return matcher.Fail(FAIL_PARAMETERS);
            }

            // Commit to one more iteration
            if (begin->hasInnerNondet)
            {
                // If it backtracks into the loop body of an earlier iteration, it must restore inner groups for that iteration.
                // Save the inner groups and reset them for the next iteration.
                matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            }
            else
            {
                // If it backtracks, the entire loop will fail, so no need to restore groups. Just reset the inner groups for
                // the next iteration.
                matcher.ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopIfSetInst));
            return false;
        }

        if (loopInfo->number < begin->repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        // Proceed to exit
        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return false;
    }